

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

void __thiscall CLPIParser::composeExtentInfo(CLPIParser *this,BitStreamWriter *writer)

{
  int iVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  int iVar8;
  int iVar9;
  uint32_t *local_58;
  uint32_t *local_50;
  
  puVar2 = (writer->super_BitStream).m_initBuffer;
  iVar5 = *(int *)&(writer->super_BitStream).m_buffer - (int)puVar2;
  iVar1 = writer->m_bitWrited + iVar5 * 8;
  iVar5 = writer->m_bitWrited + iVar5 * 8 + 7;
  if (-1 < iVar1) {
    iVar5 = iVar1;
  }
  BitStreamWriter::putBits(writer,0x20,0);
  if ((this->interleaveInfo).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->interleaveInfo).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar5 = iVar5 >> 3;
    BitStreamWriter::putBits(writer,0x20,0);
    BitStreamWriter::putBits(writer,0x18,0);
    BitStreamWriter::putBits(writer,8,(uint)this->isDependStream * 2 + 1);
    BitStreamWriter::putBits(writer,0x20,0x20004);
    puVar3 = (writer->super_BitStream).m_initBuffer;
    iVar6 = *(int *)&(writer->super_BitStream).m_buffer - (int)puVar3;
    iVar1 = writer->m_bitWrited + iVar6 * 8;
    iVar6 = writer->m_bitWrited + iVar6 * 8 + 7;
    if (-1 < iVar1) {
      iVar6 = iVar1;
    }
    BitStreamWriter::putBits(writer,0x20,0);
    BitStreamWriter::putBits(writer,0x20,0);
    if (this->isDependStream == true) {
      BitStreamWriter::putBits(writer,0x20,0x20005);
      puVar4 = (writer->super_BitStream).m_initBuffer;
      iVar9 = *(int *)&(writer->super_BitStream).m_buffer - (int)puVar4;
      iVar1 = writer->m_bitWrited + iVar9 * 8;
      iVar9 = writer->m_bitWrited + iVar9 * 8 + 7;
      if (-1 < iVar1) {
        iVar9 = iVar1;
      }
      local_58 = (uint32_t *)((long)(iVar9 >> 3) + (long)puVar4);
      BitStreamWriter::putBits(writer,0x20,0);
      BitStreamWriter::putBits(writer,0x20,0);
      BitStreamWriter::putBits(writer,0x20,0x20006);
      puVar4 = (writer->super_BitStream).m_initBuffer;
      iVar9 = *(int *)&(writer->super_BitStream).m_buffer - (int)puVar4;
      iVar1 = writer->m_bitWrited + iVar9 * 8;
      iVar9 = writer->m_bitWrited + iVar9 * 8 + 7;
      if (-1 < iVar1) {
        iVar9 = iVar1;
      }
      local_50 = (uint32_t *)((long)(iVar9 >> 3) + (long)puVar4);
      BitStreamWriter::putBits(writer,0x20,0);
      BitStreamWriter::putBits(writer,0x20,0);
    }
    else {
      local_50 = (uint32_t *)0x0;
      local_58 = (uint32_t *)0x0;
    }
    if (((*(int *)&(writer->super_BitStream).m_buffer -
         *(int *)&(writer->super_BitStream).m_initBuffer) * 8 + writer->m_bitWrited & 0x1f) != 0) {
      BitStreamWriter::putBits(writer,0x10,0);
    }
    iVar9 = *(int *)&(writer->super_BitStream).m_buffer -
            *(int *)&(writer->super_BitStream).m_initBuffer;
    iVar1 = writer->m_bitWrited + iVar9 * 8;
    iVar9 = writer->m_bitWrited + iVar9 * 8 + 7;
    if (-1 < iVar1) {
      iVar9 = iVar1;
    }
    uVar7 = my_ntohl((iVar9 >> 3) - iVar5);
    *(uint32_t *)((long)puVar2 + (long)iVar5 + 4) = uVar7;
    iVar9 = *(int *)&(writer->super_BitStream).m_buffer -
            *(int *)&(writer->super_BitStream).m_initBuffer;
    iVar1 = writer->m_bitWrited + iVar9 * 8;
    iVar9 = writer->m_bitWrited + iVar9 * 8 + 7;
    if (-1 < iVar1) {
      iVar9 = iVar1;
    }
    uVar7 = my_ntohl((iVar9 >> 3) - iVar5);
    *(uint32_t *)((long)puVar3 + (long)(iVar6 >> 3)) = uVar7;
    iVar9 = *(int *)&(writer->super_BitStream).m_buffer -
            *(int *)&(writer->super_BitStream).m_initBuffer;
    iVar1 = writer->m_bitWrited + iVar9 * 8;
    iVar9 = writer->m_bitWrited + iVar9 * 8 + 7;
    if (-1 < iVar1) {
      iVar9 = iVar1;
    }
    composeExtentStartPoint(this,writer);
    iVar8 = *(int *)&(writer->super_BitStream).m_buffer -
            *(int *)&(writer->super_BitStream).m_initBuffer;
    iVar1 = writer->m_bitWrited + iVar8 * 8;
    iVar8 = writer->m_bitWrited + iVar8 * 8 + 7;
    if (-1 < iVar1) {
      iVar8 = iVar1;
    }
    uVar7 = my_ntohl((iVar8 >> 3) - (iVar9 >> 3));
    *(uint32_t *)((long)puVar3 + (long)(iVar6 >> 3) + 4) = uVar7;
    if (this->isDependStream == true) {
      iVar6 = *(int *)&(writer->super_BitStream).m_buffer -
              *(int *)&(writer->super_BitStream).m_initBuffer;
      iVar1 = writer->m_bitWrited + iVar6 * 8;
      iVar6 = writer->m_bitWrited + iVar6 * 8 + 7;
      if (-1 < iVar1) {
        iVar6 = iVar1;
      }
      uVar7 = my_ntohl((iVar6 >> 3) - iVar5);
      *local_58 = uVar7;
      iVar6 = *(int *)&(writer->super_BitStream).m_buffer -
              *(int *)&(writer->super_BitStream).m_initBuffer;
      iVar1 = writer->m_bitWrited + iVar6 * 8;
      iVar6 = writer->m_bitWrited + iVar6 * 8 + 7;
      if (-1 < iVar1) {
        iVar6 = iVar1;
      }
      composeProgramInfo(this,writer,true);
      iVar9 = *(int *)&(writer->super_BitStream).m_buffer -
              *(int *)&(writer->super_BitStream).m_initBuffer;
      iVar1 = writer->m_bitWrited + iVar9 * 8;
      iVar9 = writer->m_bitWrited + iVar9 * 8 + 7;
      if (-1 < iVar1) {
        iVar9 = iVar1;
      }
      uVar7 = my_ntohl((iVar9 >> 3) - (iVar6 >> 3));
      local_58[1] = uVar7;
      iVar6 = *(int *)&(writer->super_BitStream).m_buffer -
              *(int *)&(writer->super_BitStream).m_initBuffer;
      iVar1 = writer->m_bitWrited + iVar6 * 8;
      iVar6 = writer->m_bitWrited + iVar6 * 8 + 7;
      if (-1 < iVar1) {
        iVar6 = iVar1;
      }
      uVar7 = my_ntohl((iVar6 >> 3) - iVar5);
      *local_50 = uVar7;
      iVar6 = *(int *)&(writer->super_BitStream).m_buffer -
              *(int *)&(writer->super_BitStream).m_initBuffer;
      iVar1 = writer->m_bitWrited + iVar6 * 8;
      iVar6 = writer->m_bitWrited + iVar6 * 8 + 7;
      if (-1 < iVar1) {
        iVar6 = iVar1;
      }
      composeCPI(this,writer,true);
      iVar9 = *(int *)&(writer->super_BitStream).m_buffer -
              *(int *)&(writer->super_BitStream).m_initBuffer;
      iVar1 = writer->m_bitWrited + iVar9 * 8;
      iVar9 = writer->m_bitWrited + iVar9 * 8 + 7;
      if (-1 < iVar1) {
        iVar9 = iVar1;
      }
      uVar7 = my_ntohl((iVar9 >> 3) - (iVar6 >> 3));
      local_50[1] = uVar7;
    }
    iVar6 = *(int *)&(writer->super_BitStream).m_buffer -
            *(int *)&(writer->super_BitStream).m_initBuffer;
    iVar1 = writer->m_bitWrited + iVar6 * 8;
    iVar6 = writer->m_bitWrited + iVar6 * 8 + 7;
    if (-1 < iVar1) {
      iVar6 = iVar1;
    }
    uVar7 = my_ntohl(((iVar6 >> 3) - iVar5) - 4);
    *(uint32_t *)((long)puVar2 + (long)iVar5) = uVar7;
  }
  return;
}

Assistant:

void CLPIParser::composeExtentInfo(BitStreamWriter& writer)
{
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    const int beforeCount = writer.getBitsCount() / 8;

    writer.putBits(32, 0);  // length

    if (interleaveInfo.empty())
        return;

    writer.putBits(32, 0);  // skip data block start address
    writer.putBits(24, 0);  // reserved for world align

    const int entries = isDependStream ? 3 : 1;
    writer.putBits(8, entries);

    // write Extent_Start_Point header

    writer.putBits(32, 0x00020004);  // extent start point
    const auto extentStartPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);

    writer.putBits(32, 0);  // skip extent start address
    writer.putBits(32, 0);  // skip extent dataLen

    uint32_t* CPI_SS_StartPos = nullptr;
    uint32_t* ProgramInfo_StartPos = nullptr;
    if (isDependStream)
    {
        // write ProgramInfo_SS header
        writer.putBits(32, 0x00020005);  // extent start point
        ProgramInfo_StartPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);

        writer.putBits(32, 0);  // skip extent start address
        writer.putBits(32, 0);  // skip extent dataLen

        // write CPI_SS header
        writer.putBits(32, 0x00020006);  // extent start point
        CPI_SS_StartPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);

        writer.putBits(32, 0);  // skip extent start address
        writer.putBits(32, 0);  // skip extent dataLen
    }

    if (writer.getBitsCount() % 32)
        writer.putBits(16, 0);

    lengthPos[1] =
        my_htonl(writer.getBitsCount() / 8 - beforeCount);  // data_block_start_address, same as extentStart point start

    // write Extent_Start_Point body
    *extentStartPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
    int beforeExtentCount = writer.getBitsCount() / 8;
    composeExtentStartPoint(writer);
    extentStartPos[1] = my_htonl(writer.getBitsCount() / 8 - beforeExtentCount);

    if (isDependStream)
    {
        // write ProgramInfo_SS body
        *ProgramInfo_StartPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
        beforeExtentCount = writer.getBitsCount() / 8;
        composeProgramInfo(writer, true);
        ProgramInfo_StartPos[1] = my_htonl(writer.getBitsCount() / 8 - beforeExtentCount);

        // write CPI_SS body
        *CPI_SS_StartPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
        beforeExtentCount = writer.getBitsCount() / 8;
        composeCPI(writer, true);
        CPI_SS_StartPos[1] = my_htonl(writer.getBitsCount() / 8 - beforeExtentCount);
    }

    *lengthPos = my_htonl(writer.getBitsCount() / 8 - beforeCount - 4);
}